

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

string * __thiscall project::get_msvc_config_abi_cxx11_(project *this)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  reference pbVar4;
  long in_RSI;
  string *in_RDI;
  buildExport *in_stack_00000090;
  string *in_stack_00000098;
  project *in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *library;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  buildExport b;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa08;
  buildExport *in_stack_fffffffffffffa10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f0;
  undefined1 *local_4e8;
  string *local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  undefined1 *local_4c8;
  string *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b0;
  undefined1 *local_4a8;
  string *local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  undefined1 *local_488;
  undefined4 local_480;
  allocator local_47a;
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [55];
  allocator local_419;
  string local_418 [32];
  byte local_3f8;
  undefined1 auStack_3d0 [24];
  undefined1 auStack_3b8 [56];
  string local_380 [32];
  string local_360 [280];
  undefined1 auStack_248 [24];
  undefined1 auStack_230 [152];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  buildExport::buildExport(in_stack_fffffffffffffa10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"VS2019",&local_419);
  get_export(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  if ((local_3f8 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"VS2017",&local_451);
    get_export(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    if ((local_3f8 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,"VS2015",&local_479);
      get_export(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
      if ((local_3f8 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(in_RDI,"",&local_47a);
        std::allocator<char>::~allocator((allocator<char> *)&local_47a);
        goto LAB_00111610;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Using VS2015 Config");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Using VS2017 Config");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Using VS2019 Config");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffa20);
  if (!bVar1) {
    std::operator<<(local_188,"\n");
    poVar2 = std::operator<<(local_188,"    target_include_directories(");
    poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
    std::operator<<(poVar2," PUBLIC\n");
    local_488 = auStack_248;
    local_490._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa08);
    local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffa08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa10,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa08), bVar1) {
      local_4a0 = (string *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_490);
      poVar2 = std::operator<<(local_188,"        \"${CMAKE_SYSROOT}/");
      poVar2 = std::operator<<(poVar2,local_4a0);
      std::operator<<(poVar2,"\"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_490);
    }
    std::operator<<(local_188,"    )\n");
    std::operator<<(local_188,"\n");
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(in_stack_fffffffffffffa20), !bVar1)) {
    std::operator<<(local_188,"\n");
    poVar2 = std::operator<<(local_188,"    target_compile_options(");
    poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
    std::operator<<(poVar2," PUBLIC \n");
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<(local_188,"        ");
      poVar2 = std::operator<<(poVar2,local_380);
      std::operator<<(poVar2,"\n");
    }
    local_4a8 = auStack_3d0;
    local_4b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa08);
    local_4b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffa08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa10,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa08), bVar1) {
      local_4c0 = (string *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_4b0);
      poVar2 = std::operator<<(local_188,"        ");
      poVar2 = std::operator<<(poVar2,local_4c0);
      std::operator<<(poVar2,"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_4b0);
    }
    std::operator<<(local_188,"    )\n");
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffa20);
  if (!bVar1) {
    std::operator<<(local_188,"\n");
    poVar2 = std::operator<<(local_188,"    target_link_directories(");
    poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
    std::operator<<(poVar2," BEFORE PUBLIC\n");
    local_4c8 = auStack_230;
    local_4d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa08);
    local_4d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffa08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa10,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa08), bVar1) {
      local_4e0 = (string *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_4d0);
      poVar2 = std::operator<<(local_188,"        \"${CMAKE_SYSROOT}/");
      poVar2 = std::operator<<(poVar2,local_4e0);
      std::operator<<(poVar2,"\"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_4d0);
    }
    std::operator<<(local_188,"    )\n");
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffa20);
  if ((!bVar1) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    std::operator<<(local_188,"\n");
    poVar2 = std::operator<<(local_188,"    target_link_libraries(");
    poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
    std::operator<<(poVar2,"\n");
    local_4e8 = auStack_3b8;
    local_4f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_fffffffffffffa08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa10,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa08), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_4f0);
      poVar2 = std::operator<<(local_188,"        ");
      poVar2 = std::operator<<(poVar2,(string *)pbVar4);
      std::operator<<(poVar2,"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_4f0);
    }
    poVar2 = std::operator<<(local_188,"        ");
    in_stack_fffffffffffffa10 = (buildExport *)std::operator<<(poVar2,local_360);
    std::operator<<((ostream *)in_stack_fffffffffffffa10,"\n");
    std::operator<<(local_188,"    )\n");
  }
  std::__cxx11::stringstream::str();
LAB_00111610:
  local_480 = 1;
  buildExport::~buildExport(in_stack_fffffffffffffa10);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string project::get_msvc_config()
{
    std::stringstream ss;

    project::buildExport b;

    get_export("VS2019", b);
    if(!b.valid)
    {
        get_export("VS2017", b);
        if(!b.valid)
        {
            get_export("VS2015", b);
            if(b.valid)
            {
                std::cout << "Using VS2015 Config" << std::endl;
            }
            else
            {
                return "";
            }
            
        }
        else
        {
            std::cout << "Using VS2017 Config" << std::endl;
        }
    }
    else
    {
        std::cout << "Using VS2019 Config" << std::endl;
    }
    
    if(!b.debug.headerPath.empty())
    {
        ss << "\n";
        ss << "    target_include_directories(" << name << " PUBLIC\n";
        for(auto const& path : b.debug.headerPath)
        {
            ss << "        \"${CMAKE_SYSROOT}/" << path << "\"\n";
        }
        ss << "    )\n";
        ss << "\n";
    }
    if(!b.extraCompilerFlags.empty() || !b.extraDefs.empty())
    {
        ss << "\n";
        ss << "    target_compile_options(" << name << " PUBLIC \n";
        if(!b.extraCompilerFlags.empty())
        {
            ss << "        " << b.extraCompilerFlags << "\n";
        }
        for(auto const& def : b.extraDefs)
        {
            ss << "        " << def << "\n";
        }
        ss << "    )\n";
    }
    if(!b.debug.libraryPath.empty())
    {
        ss << "\n";
        ss << "    target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "        \"${CMAKE_SYSROOT}/" << path << "\"\n";
        }
        ss << "    )\n";
    }
    if(!b.externalLibraries.empty() || !b.extraLinkerFlags.empty())
    {
        ss << "\n";
        ss << "    target_link_libraries(" << name << "\n";
        for(auto const& library : b.externalLibraries)
        {
            ss << "        " << library << "\n";
        }
        ss << "        " << b.extraLinkerFlags << "\n";
        ss << "    )\n";
    }

    return ss.str();
}